

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O0

string * __thiscall
miniros::NodeHandle::resolveName(void *param_1,string *param_2,string *param_3,byte param_4)

{
  ulong uVar1;
  char *pcVar2;
  ostream *poVar3;
  undefined8 uVar4;
  stringstream ss;
  string final;
  string *in_stack_fffffffffffffd48;
  InvalidNameException *in_stack_fffffffffffffd50;
  undefined1 _remap;
  string *in_stack_fffffffffffffd58;
  string *in_stack_fffffffffffffd98;
  string *in_stack_fffffffffffffdb0;
  NodeHandle *in_stack_fffffffffffffdb8;
  string local_228 [39];
  undefined1 local_201;
  stringstream local_1e0 [16];
  ostream local_1d0 [392];
  string local_48 [39];
  byte local_21;
  string *local_20;
  string *local_18;
  void *local_8;
  
  local_21 = param_4 & 1;
  local_20 = param_3;
  local_18 = param_2;
  local_8 = param_1;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::string(local_48,local_20);
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
    if (*pcVar2 == '~') {
      std::__cxx11::stringstream::stringstream(local_1e0);
      std::operator<<(local_1d0,
                      "Using ~ names with NodeHandle methods is not allowed.  If you want to use private names with the NodeHandle "
                     );
      std::operator<<(local_1d0,
                      "interface, construct a NodeHandle using a private name as its namespace.  e.g. "
                     );
      std::operator<<(local_1d0,"miniros::NodeHandle nh(\"~\");  ");
      std::operator<<(local_1d0,"nh.getParam(\"my_private_name\");");
      poVar3 = std::operator<<(local_1d0," (name = [");
      poVar3 = std::operator<<(poVar3,local_20);
      std::operator<<(poVar3,"])");
      local_201 = 1;
      uVar4 = __cxa_allocate_exception(0x10);
      std::__cxx11::stringstream::str();
      InvalidNameException::InvalidNameException
                (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      local_201 = 0;
      __cxa_throw(uVar4,&InvalidNameException::typeinfo,InvalidNameException::~InvalidNameException)
      ;
    }
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_48);
    if ((*pcVar2 != '/') && (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) == 0)) {
      names::append(&in_stack_fffffffffffffdb8->namespace_,in_stack_fffffffffffffdb0);
      std::__cxx11::string::operator=(local_48,local_228);
      std::__cxx11::string::~string(local_228);
    }
    _remap = (undefined1)((ulong)pcVar2 >> 0x38);
    names::clean(in_stack_fffffffffffffd98);
    std::__cxx11::string::operator=(local_48,(string *)&stack0xfffffffffffffdb8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdb8);
    if ((local_21 & 1) != 0) {
      remapName(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
      std::__cxx11::string::operator=(local_48,(string *)&stack0xfffffffffffffd98);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd98);
    }
    names::resolve(in_stack_fffffffffffffd58,(bool)_remap);
    std::__cxx11::string::~string(local_48);
  }
  else {
    std::__cxx11::string::string((string *)param_1,param_2);
  }
  return (string *)param_1;
}

Assistant:

std::string NodeHandle::resolveName(const std::string& name, bool remap, no_validate) const
{
  if (name.empty())
  {
    return namespace_;
  }

  std::string final = name;

  if (final[0] == '~')
  {
    std::stringstream ss;
    ss << "Using ~ names with NodeHandle methods is not allowed.  If you want to use private names with the NodeHandle ";
    ss << "interface, construct a NodeHandle using a private name as its namespace.  e.g. ";
    ss << "miniros::NodeHandle nh(\"~\");  ";
    ss << "nh.getParam(\"my_private_name\");";
    ss << " (name = [" << name << "])";
    throw InvalidNameException(ss.str());
  }
  else if (final[0] == '/')
  {
    // do nothing
  }
  else if (!namespace_.empty())
  {
    // MINIROS_DEBUG("Appending namespace_ (%s)", namespace_.c_str());
    final = names::append(namespace_, final);
  }

  // MINIROS_DEBUG("resolveName, pre-clean: %s", final.c_str());
  final = names::clean(final);
  // MINIROS_DEBUG("resolveName, post-clean: %s", final.c_str());

  if (remap)
  {
    final = remapName(final);
    // MINIROS_DEBUG("resolveName, remapped: %s", final.c_str());
  }

  return names::resolve(final, false);
}